

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

uint __thiscall
HashTbl::CountAndVerifyItems(HashTbl *this,IdentPtr *buckets,uint bucketCount,uint mask)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IdentPtr local_30;
  IdentPtr pid;
  uint i;
  uint count;
  uint mask_local;
  uint bucketCount_local;
  IdentPtr *buckets_local;
  HashTbl *this_local;
  
  pid._4_4_ = 0;
  pid._0_4_ = 0;
  do {
    if (bucketCount <= (uint)pid) {
      return pid._4_4_;
    }
    for (local_30 = buckets[(uint)pid]; local_30 != (IdentPtr)0x0; local_30 = local_30->m_pidNext) {
      if ((local_30->m_luHash & mask) != (uint)pid) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                           ,0x7d,"((pid->m_luHash & mask) == i)","(pid->m_luHash & mask) == i");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pid._4_4_ = pid._4_4_ + 1;
    }
    pid._0_4_ = (uint)pid + 1;
  } while( true );
}

Assistant:

uint HashTbl::CountAndVerifyItems(IdentPtr *buckets, uint bucketCount, uint mask)
{
    uint count = 0;
    for (uint i = 0; i < bucketCount; i++)
        for (IdentPtr pid = buckets[i]; pid; pid = pid->m_pidNext)
        {
            Assert((pid->m_luHash & mask) == i);
            count++;
        }
    return count;
}